

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::SequenceFeatureType::clear_Type(SequenceFeatureType *this)

{
  if (((this->_oneof_case_[0] == 3) || (this->_oneof_case_[0] == 1)) &&
     ((this->Type_).int64type_ != (Int64FeatureType *)0x0)) {
    (*(((this->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void SequenceFeatureType::clear_Type() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.SequenceFeatureType)
  switch (Type_case()) {
    case kInt64Type: {
      delete Type_.int64type_;
      break;
    }
    case kStringType: {
      delete Type_.stringtype_;
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = TYPE_NOT_SET;
}